

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<6>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  RepeatedField<unsigned_long> *array;
  int index;
  undefined4 local_30;
  uint32 local_2c;
  
  if (*field != 0) {
    local_2c = md->tag;
    PrimitiveTypeHelper<13>::Serialize(&local_2c,output);
    local_30 = *(undefined4 *)((long)field + 0x10);
    PrimitiveTypeHelper<13>::Serialize(&local_30,output);
    if (0 < *field) {
      index = 0;
      do {
        puVar2 = RepeatedField<unsigned_long>::Get((RepeatedField<unsigned_long> *)field,index);
        uVar1 = *puVar2;
        puVar2 = (unsigned_long *)output->cur_;
        if ((output->impl_).end_ <= puVar2) {
          puVar2 = (unsigned_long *)
                   io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,(uint8 *)puVar2);
        }
        output->cur_ = (uint8 *)puVar2;
        *puVar2 = uVar1;
        output->cur_ = (uint8 *)(puVar2 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}